

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

bool __thiscall
QFileSystemModel::setData(QFileSystemModel *this,QModelIndex *idx,QVariant *value,int role)

{
  QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *this_00;
  QFileSystemModelPrivate *this_01;
  QFileSystemNode *this_02;
  QFileInfoGatherer *this_03;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  QFileSystemNode *pQVar6;
  QFileSystemNode **ppQVar7;
  pointer __p;
  long in_FS_OFFSET;
  QDir local_c8 [8];
  QFileInfo local_c0 [8];
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  anon_union_24_3_e3d07ef4_for_data local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QFileSystemModelPrivate **)&this->field_0x8;
  bVar1 = QModelIndex::isValid(idx);
  if (!bVar1) {
LAB_0056f432:
    bVar1 = false;
    goto LAB_0056f434;
  }
  bVar1 = false;
  if ((role != 2) || (idx->c != 0)) goto LAB_0056f434;
  uVar5 = (**(code **)(*(long *)this + 0x138))(this,idx);
  if ((uVar5 & 2) == 0) goto LAB_0056f432;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toString();
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_60,idx,0);
  ::QVariant::toString();
  ::QVariant::~QVariant((QVariant *)&local_60);
  bVar2 = ::comparesEqual((QString *)&local_78,(QString *)&local_98);
  bVar1 = true;
  if (!bVar2) {
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d._0_4_ = 0xaaaaaaaa;
    local_b8.d._4_4_ = 0xaaaaaaaa;
    local_b8.ptr._0_4_ = 0xaaaaaaaa;
    local_b8.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)this + 0x68))(&local_60,this,idx);
    filePath((QString *)&local_b8,this,(QModelIndex *)&local_60);
    if ((undefined1 *)local_78.size == (undefined1 *)0x0) {
LAB_0056f6ce:
      bVar1 = false;
    }
    else {
      QDir::toNativeSeparators((QString *)local_60.data);
      bVar1 = QString::contains((QString *)&local_60,(QChar)0x2f,CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
      if (bVar1) goto LAB_0056f6ce;
      QDir::QDir((QDir *)local_60.data,(QString *)&local_b8);
      cVar3 = QDir::rename((QString *)local_60.data,(QString *)&local_98);
      QDir::~QDir((QDir *)local_60.data);
      if (cVar3 == '\0') goto LAB_0056f6ce;
      pQVar6 = QFileSystemModelPrivate::node(this_01,idx);
      this_02 = pQVar6->parent;
      this_00 = &this_02->children;
      pQVar6 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                         (this_00,&pQVar6->fileName);
      iVar4 = QFileSystemModelPrivate::QFileSystemNode::visibleLocation(this_02,&pQVar6->fileName);
      QList<QString>::removeAt(&this_02->visibleChildren,(long)iVar4);
      pQVar6 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::takeImpl<QString>
                         (this_00,(QString *)&local_98);
      QString::operator=(&pQVar6->fileName,(QString *)&local_78);
      pQVar6->parent = this_02;
      this_03 = (this_01->fileInfoGatherer)._M_t.
                super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>.
                _M_t.
                super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl;
      QDir::QDir(local_c8,(QString *)&local_b8);
      QFileInfo::QFileInfo(local_c0,local_c8,(QString *)&local_78);
      QFileInfoGatherer::getInfo
                ((QExtendedInformation *)&local_60,(QFileInfoGatherer *)this_03,local_c0);
      QFileSystemModelPrivate::QFileSystemNode::populate(pQVar6,(QExtendedInformation *)&local_60);
      QExtendedInformation::~QExtendedInformation((QExtendedInformation *)&local_60);
      QFileInfo::~QFileInfo(local_c0);
      QDir::~QDir(local_c8);
      pQVar6->isVisible = true;
      local_60.shared = (PrivateShared *)0x0;
      ppQVar7 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::operator[]
                          (this_00,(QString *)&local_78);
      *ppQVar7 = pQVar6;
      QList<QString>::emplace<QString_const&>
                (&this_02->visibleChildren,(long)iVar4,(QString *)&local_78);
      QFileSystemModelPrivate::delayedSort(this_01);
      fileRenamed(this,(QString *)&local_b8,(QString *)&local_98,(QString *)&local_78);
      std::
      unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
      ::~unique_ptr((unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                     *)&local_60.shared);
      bVar1 = true;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
LAB_0056f434:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::setData(const QModelIndex &idx, const QVariant &value, int role)
{
    Q_D(QFileSystemModel);
    if (!idx.isValid()
        || idx.column() != 0
        || role != Qt::EditRole
        || (flags(idx) & Qt::ItemIsEditable) == 0) {
        return false;
    }

    QString newName = value.toString();
#ifdef Q_OS_WIN
    chopSpaceAndDot(newName);
    if (newName.isEmpty())
        return false;
#endif

    QString oldName = idx.data().toString();
    if (newName == oldName)
        return true;

    const QString parentPath = filePath(parent(idx));

    if (newName.isEmpty() || QDir::toNativeSeparators(newName).contains(QDir::separator()))
        return false;

#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
    // QTBUG-65683: Remove file system watchers prior to renaming to prevent
    // failure due to locked files on Windows.
    const QStringList watchedPaths = d->unwatchPathsAt(idx);
#endif // filesystemwatcher && Q_OS_WIN
    if (!QDir(parentPath).rename(oldName, newName)) {
#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
        d->watchPaths(watchedPaths);
#endif
        return false;
    } else {
        /*
            *After re-naming something we don't want the selection to change*
            - can't remove rows and later insert
            - can't quickly remove and insert
            - index pointer can't change because treeview doesn't use persistent index's

            - if this get any more complicated think of changing it to just
              use layoutChanged
         */

        QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(idx);
        QFileSystemModelPrivate::QFileSystemNode *parentNode = indexNode->parent;
        int visibleLocation = parentNode->visibleLocation(parentNode->children.value(indexNode->fileName)->fileName);

        parentNode->visibleChildren.removeAt(visibleLocation);
        std::unique_ptr<QFileSystemModelPrivate::QFileSystemNode> nodeToRename(parentNode->children.take(oldName));
        nodeToRename->fileName = newName;
        nodeToRename->parent = parentNode;
#if QT_CONFIG(filesystemwatcher)
        nodeToRename->populate(d->fileInfoGatherer->getInfo(QFileInfo(parentPath, newName)));
#endif
        nodeToRename->isVisible = true;
        parentNode->children[newName] = nodeToRename.release();
        parentNode->visibleChildren.insert(visibleLocation, newName);

        d->delayedSort();
        emit fileRenamed(parentPath, oldName, newName);
    }
    return true;
}